

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

void Curl_doh_close(Curl_easy *data)

{
  doh_probes *pdVar1;
  long mid;
  bool bVar2;
  Curl_easy *in_RAX;
  long lVar3;
  bool bVar4;
  Curl_easy *probe_data;
  Curl_easy *local_28;
  
  pdVar1 = (data->req).doh;
  if ((pdVar1 != (doh_probes *)0x0) && (data->multi != (Curl_multi *)0x0)) {
    lVar3 = 0;
    bVar2 = true;
    local_28 = in_RAX;
    do {
      bVar4 = bVar2;
      mid = pdVar1->probe[lVar3].easy_mid;
      if (-1 < mid) {
        pdVar1->probe[lVar3].easy_mid = -1;
        if (data->multi == (Curl_multi *)0x0) {
          local_28 = (Curl_easy *)0x0;
        }
        else {
          local_28 = Curl_multi_get_handle(data->multi,mid);
          if (local_28 != (Curl_easy *)0x0) {
            curl_multi_remove_handle(data->multi,local_28);
            Curl_close(&local_28);
          }
        }
      }
      lVar3 = 1;
      bVar2 = false;
    } while (bVar4);
  }
  return;
}

Assistant:

void Curl_doh_close(struct Curl_easy *data)
{
  struct doh_probes *doh = data->req.doh;
  if(doh && data->multi) {
    struct Curl_easy *probe_data;
    curl_off_t mid;
    size_t slot;
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      mid = doh->probe[slot].easy_mid;
      if(mid < 0)
        continue;
      doh->probe[slot].easy_mid = -1;
      /* should have been called before data is removed from multi handle */
      DEBUGASSERT(data->multi);
      probe_data = data->multi ? Curl_multi_get_handle(data->multi, mid) :
        NULL;
      if(!probe_data) {
        DEBUGF(infof(data, "Curl_doh_close: xfer for mid=%"
                     FMT_OFF_T " not found!",
                     doh->probe[slot].easy_mid));
        continue;
      }
      /* data->multi might already be reset at this time */
      curl_multi_remove_handle(data->multi, probe_data);
      Curl_close(&probe_data);
    }
  }
}